

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O0

int lreplace(RSIZE plen,char *st)

{
  ushort uVar1;
  int len;
  int iVar2;
  byte *__s;
  size_t sVar3;
  ushort **ppuVar4;
  bool bVar5;
  bool bVar6;
  char *repl;
  int is_replace_alllower;
  int is_query_allcaps;
  int is_query_capitalised;
  int doto;
  int s;
  RSIZE n;
  line *lp;
  RSIZE rlen;
  char *st_local;
  RSIZE plen_local;
  
  bVar5 = false;
  st_local._4_4_ = checkdirty(curbp);
  if (st_local._4_4_ == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      __s = (byte *)strdup(st);
      if (__s == (byte *)0x0) {
        dobeep();
        ewprintf("out of memory");
        st_local._4_4_ = 0;
      }
      else {
        sVar3 = strlen((char *)__s);
        len = (int)sVar3;
        undo_boundary_enable(8,0);
        backchar(0xf,plen);
        if ((casereplace == 1) && (_s = curwp->w_dotp, _s->l_text != (char *)0x0)) {
          is_query_allcaps = curwp->w_doto;
          ppuVar4 = __ctype_b_loc();
          uVar1 = (*ppuVar4)[(int)(uint)(byte)_s->l_text[is_query_allcaps]];
          if ((uVar1 & 0x100) != 0) {
            bVar5 = true;
            for (doto = 0; doto < plen && bVar5; doto = doto + 1) {
              ppuVar4 = __ctype_b_loc();
              bVar5 = true;
              if (((*ppuVar4)[(int)(uint)(byte)_s->l_text[is_query_allcaps]] & 0x400) != 0) {
                ppuVar4 = __ctype_b_loc();
                bVar5 = ((*ppuVar4)[(int)(uint)(byte)_s->l_text[is_query_allcaps]] & 0x100) != 0;
              }
              is_query_allcaps = is_query_allcaps + 1;
              if (is_query_allcaps == _s->l_used) {
                is_query_allcaps = 0;
                _s = _s->l_fp;
                doto = doto + 1;
              }
            }
          }
          bVar6 = true;
          for (doto = 0; doto < len && bVar6; doto = doto + 1) {
            ppuVar4 = __ctype_b_loc();
            bVar6 = ((*ppuVar4)[(int)(uint)__s[doto]] & 0x100) == 0;
          }
          if (bVar6) {
            if (bVar5) {
              for (doto = 0; doto < len; doto = doto + 1) {
                iVar2 = toupper((uint)__s[doto]);
                __s[doto] = (byte)iVar2;
              }
            }
            else if ((uVar1 & 0x100) != 0) {
              iVar2 = toupper((uint)*__s);
              *__s = (byte)iVar2;
            }
          }
        }
        ldelete(plen,0);
        region_put_data((char *)__s,len);
        lchange(8);
        undo_boundary_enable(8,1);
        free(__s);
        st_local._4_4_ = 1;
      }
    }
    else {
      dobeep();
      ewprintf("Buffer is read only");
      st_local._4_4_ = 0;
    }
  }
  return st_local._4_4_;
}

Assistant:

int
lreplace(RSIZE plen, char *st)
{
	RSIZE	rlen;	/* replacement length		 */
	struct line *lp;
	RSIZE n;
	int s, doto, is_query_capitalised = 0, is_query_allcaps = 0;
	int is_replace_alllower = 0;
	char *repl = NULL;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read only");
		return (FALSE);
	}

	if ((repl = strdup(st)) == NULL) {
		dobeep();
		ewprintf("out of memory");
		return (FALSE);
	}
	rlen = strlen(repl);

	undo_boundary_enable(FFRAND, 0);
	(void)backchar(FFARG | FFRAND, (int)plen);

	if (casereplace != TRUE)
		goto done;

	lp = curwp->w_dotp;
	if (ltext(lp) == NULL)
		goto done;
	doto = curwp->w_doto;
	n = plen;

	is_query_capitalised = isupper((unsigned char)lgetc(lp, doto));

	if (is_query_capitalised) {
		for (n = 0, is_query_allcaps = 1; n < plen && is_query_allcaps;
		    n++) {
			is_query_allcaps = !isalpha((unsigned char)lgetc(lp,
			    doto)) || isupper((unsigned char)lgetc(lp, doto));
			doto++;
			if (doto == llength(lp)) {
				doto = 0;
				lp = lforw(lp);
				n++; /* \n is implicit in the buffer */
			}
		}
	}

	for (n = 0, is_replace_alllower = 1; n < rlen && is_replace_alllower;
	    n++)
		is_replace_alllower = !isupper((unsigned char)repl[n]);

	if (is_replace_alllower) {
		if (is_query_allcaps) {
			for (n = 0; n < rlen; n++)
				repl[n] = toupper((unsigned char)repl[n]);
		} else if (is_query_capitalised) {
			repl[0] = toupper((unsigned char)repl[0]);
		}
	}

 done:
	(void)ldelete(plen, KNONE);
	region_put_data(repl, rlen);
	lchange(WFFULL);

	undo_boundary_enable(FFRAND, 1);

	free(repl);
	return (TRUE);
}